

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O0

void __thiscall
Rml::Property::Property<std::vector<Rml::Animation,std::allocator<Rml::Animation>>>
          (Property *this,vector<Rml::Animation,_std::allocator<Rml::Animation>_> *value,Unit unit,
          int specificity)

{
  int specificity_local;
  Unit unit_local;
  vector<Rml::Animation,_std::allocator<Rml::Animation>_> *value_local;
  Property *this_local;
  
  Variant::Variant<std::vector<Rml::Animation,std::allocator<Rml::Animation>>&,void>
            (&this->value,value);
  this->unit = unit;
  this->specificity = specificity;
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  ::std::shared_ptr<const_Rml::PropertySource>::shared_ptr(&this->source);
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  return;
}

Assistant:

Property(PropertyType value, Unit unit, int specificity = -1) : value(value), unit(unit), specificity(specificity)
	{
		definition = nullptr;
		parser_index = -1;
	}